

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O1

char * map2json_create(map2json_t *obj)

{
  s_stringlib_token *token;
  int iVar1;
  map2json_tree_t *pmVar2;
  stringlib_tokens_t *tokens;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  s_map2json_tree *psVar7;
  s_map2json_tree *psVar8;
  long lVar9;
  long lVar10;
  map2json_keyvalue_t *pmVar11;
  
  map2json_freeTreeMemory(obj->tree);
  pmVar2 = (map2json_tree_t *)malloc(0x40);
  pmVar2->next = (s_map2json_tree *)0x0;
  pmVar2->children = (s_map2json_tree *)0x0;
  pmVar2->arrayObjects = (s_map2json_tree *)0x0;
  pmVar2->type = JSMN_OBJECT;
  *(undefined4 *)&pmVar2->arrayId = 0xffffffff;
  *(undefined4 *)((long)&pmVar2->arrayId + 4) = 0xffffffff;
  *(undefined4 *)&pmVar2->maxArrayId = 0xffffffff;
  *(undefined4 *)((long)&pmVar2->maxArrayId + 4) = 0xffffffff;
  pmVar2->key = (char *)0x0;
  pmVar2->value = (char *)0x0;
  obj->tree = pmVar2;
  pmVar11 = obj->pairs;
  do {
    if (pmVar11 == (map2json_keyvalue_t *)0x0) {
      safe_strcpy(obj->buffer,"");
      map2json_createJsonString(obj->buffer,obj->tree);
      return obj->buffer->data;
    }
    tokens = stringlib_splitTokens(pmVar11->key,'.');
    psVar8 = pmVar2;
    for (token = tokens; token != (stringlib_tokens_t *)0x0; token = token->next) {
      pcVar3 = stringlib_getToken(token,pmVar11->key);
      pcVar4 = strchr(pcVar3,0x5b);
      if ((pcVar4 == (char *)0x0) || (pcVar5 = strchr(pcVar3,0x5d), pcVar5 == (char *)0x0)) {
        lVar9 = 0;
      }
      else {
        lVar9 = (long)pcVar4 - (long)pcVar3;
      }
      if (lVar9 == 0) {
        lVar10 = -1;
      }
      else {
        sVar6 = strlen(pcVar3 + lVar9 + 1);
        pcVar4 = (char *)calloc(1,sVar6);
        memcpy(pcVar4,pcVar3 + lVar9 + 1,sVar6);
        pcVar4[sVar6 - 1] = '\0';
        if (pcVar3[lVar9 + 1] == 'x') {
          free(pcVar4);
          lVar10 = -2;
        }
        else {
          iVar1 = atoi(pcVar4);
          free(pcVar4);
          lVar10 = (long)iVar1;
        }
        pcVar3[lVar9] = '\0';
      }
      for (psVar7 = psVar8->children; psVar7 != (s_map2json_tree *)0x0; psVar7 = psVar7->next) {
        iVar1 = strcmp(psVar7->key,pcVar3);
        if (iVar1 == 0) goto LAB_00104a7b;
      }
      psVar7 = (s_map2json_tree *)0x0;
LAB_00104a7b:
      if (psVar7 == (s_map2json_tree *)0x0) {
        psVar7 = (s_map2json_tree *)malloc(0x40);
        psVar7->value = (char *)0x0;
        psVar7->next = (s_map2json_tree *)0x0;
        psVar7->children = (s_map2json_tree *)0x0;
        psVar7->arrayObjects = (s_map2json_tree *)0x0;
        psVar7->type = JSMN_OBJECT;
        *(undefined4 *)&psVar7->arrayId = 0xffffffff;
        *(undefined4 *)((long)&psVar7->arrayId + 4) = 0xffffffff;
        *(undefined4 *)&psVar7->maxArrayId = 0xffffffff;
        *(undefined4 *)((long)&psVar7->maxArrayId + 4) = 0xffffffff;
        if (pcVar3 == (char *)0x0) {
          psVar7->key = (char *)0x0;
        }
        else {
          sVar6 = strlen(pcVar3);
          pcVar4 = (char *)calloc(1,sVar6 + 1);
          psVar7->key = pcVar4;
          memcpy(pcVar4,pcVar3,sVar6);
        }
        psVar7->next = psVar8->children;
        psVar8->children = psVar7;
        if (lVar9 != 0) {
          psVar7->type = JSMN_ARRAY;
        }
      }
      psVar8 = psVar7;
      if ((lVar9 != 0) && (lVar10 != -2)) {
        for (psVar8 = psVar7->arrayObjects; psVar8 != (s_map2json_tree *)0x0;
            psVar8 = psVar8->arrayObjects) {
          if (psVar8->arrayId == lVar10) goto LAB_00104b81;
        }
        psVar8 = (s_map2json_tree *)malloc(0x40);
        psVar8->next = (s_map2json_tree *)0x0;
        psVar8->children = (s_map2json_tree *)0x0;
        psVar8->arrayObjects = (s_map2json_tree *)0x0;
        psVar8->type = JSMN_OBJECT;
        *(undefined4 *)&psVar8->arrayId = 0xffffffff;
        *(undefined4 *)((long)&psVar8->arrayId + 4) = 0xffffffff;
        *(undefined4 *)&psVar8->maxArrayId = 0xffffffff;
        *(undefined4 *)((long)&psVar8->maxArrayId + 4) = 0xffffffff;
        psVar8->key = (char *)0x0;
        psVar8->value = (char *)0x0;
        if (psVar7->maxArrayId < lVar10) {
          psVar7->maxArrayId = lVar10 + 1;
        }
        psVar8->arrayId = lVar10;
        psVar8->arrayObjects = psVar7->arrayObjects;
        psVar7->arrayObjects = psVar8;
      }
LAB_00104b81:
      free(pcVar3);
    }
    pcVar3 = pmVar11->value;
    if (psVar8->type == JSMN_ARRAY) {
      iVar1 = atoi(pcVar3);
      psVar8->maxArrayId = (long)iVar1;
    }
    else {
      iVar1 = stringlib_isInteger(pcVar3);
      if ((((iVar1 == 0) && (iVar1 = strcmp(pcVar3,"null"), iVar1 != 0)) &&
          (iVar1 = strcmp(pcVar3,"true"), iVar1 != 0)) &&
         ((iVar1 = strcmp(pcVar3,"false"), iVar1 != 0 && (*pcVar3 != '\x1b')))) {
        psVar8->type = JSMN_STRING;
      }
      else {
        psVar8->type = JSMN_PRIMITIVE;
        psVar8->value = pcVar3;
        if (*pcVar3 != '\x1b') goto LAB_00104bd9;
        pcVar3 = pcVar3 + 1;
      }
      psVar8->value = pcVar3;
    }
LAB_00104bd9:
    pmVar11 = pmVar11->next;
    stringlib_freeTokens(tokens);
  } while( true );
}

Assistant:

char *map2json_create(map2json_t *obj) {
	DEBUG_PUT("map2json_create([map2json_t *])... ");

	map2json_freeTreeMemory(obj->tree);

	map2json_createTree(obj);
	safe_strcpy(obj->buffer, "");
	map2json_createJsonString(obj->buffer, obj->tree);

	DEBUG_PUT("map2json_create([map2json_t *])... DONE");
	return obj->buffer->data;
}